

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

bool __thiscall
Js::PolymorphicInlineCache::HasDifferentType<true>
          (PolymorphicInlineCache *this,bool isProto,Type *type,Type *typeWithoutProperty)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (typeWithoutProperty != (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x278,"(!isAccessor && !isProto || !typeWithoutProperty)",
                                "!isAccessor && !isProto || !typeWithoutProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = InlineCache::HasDifferentType<true>
                    (this->inlineCaches + ((uint)((ulong)type >> 6) & this->size - 1),isProto,type,
                     typeWithoutProperty);
  return bVar2;
}

Assistant:

bool PolymorphicInlineCache::HasDifferentType(
        const bool isProto,
        const Type * type,
        const Type * typeWithoutProperty) const
    {
        Assert(!isAccessor && !isProto || !typeWithoutProperty);

        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
        if (inlineCaches[inlineCacheIndex].HasDifferentType<isAccessor>(isProto, type, typeWithoutProperty))
        {
            return true;
        }

        if (!isAccessor && !isProto && typeWithoutProperty)
        {
            inlineCacheIndex = GetInlineCacheIndexForType(typeWithoutProperty);
            return inlineCaches[inlineCacheIndex].HasDifferentType<isAccessor>(isProto, type, typeWithoutProperty);
        }

        return false;
    }